

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalGet
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          GlobalGet *curr)

{
  Module *this_00;
  char *pcVar1;
  size_t sVar2;
  Global *pGVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  
  this_00 = (this->super_ExpressionRunner<wasm::CExpressionRunner>).module;
  if (((this_00 != (Module *)0x0) &&
      (pGVar3 = Module::getGlobal(this_00,(Name)(curr->name).super_IString.str),
      (pGVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     (pGVar3->mutable_ == false)) {
    ExpressionRunner<wasm::CExpressionRunner>::visit
              (__return_storage_ptr__,&this->super_ExpressionRunner<wasm::CExpressionRunner>,
               pGVar3->init);
    return __return_storage_ptr__;
  }
  pcVar1 = (curr->name).super_IString.str._M_str;
  p_Var5 = (_Hash_node_base *)0x0;
  p_Var4 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->globalValues)._M_h,
                      (ulong)pcVar1 % (this->globalValues)._M_h._M_bucket_count,&curr->name,
                      (__hash_code)pcVar1);
  pcVar1 = DAT_00dbd0d0;
  sVar2 = NONCONSTANT_FLOW;
  if (p_Var4 != (__node_base_ptr)0x0) {
    p_Var5 = p_Var4->_M_nxt;
  }
  if (p_Var5 == (_Hash_node_base *)0x0) {
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar2;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar1;
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Literals *)(p_Var5 + 3));
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalGet(GlobalGet* curr) {
    NOTE_ENTER("GlobalGet");
    NOTE_NAME(curr->name);
    if (this->module != nullptr) {
      auto* global = this->module->getGlobal(curr->name);
      // Check if the global has an immutable value anyway
      if (!global->imported() && !global->mutable_) {
        return ExpressionRunner<SubType>::visit(global->init);
      }
    }
    // Check if a constant value has been set in the context of this runner.
    auto iter = globalValues.find(curr->name);
    if (iter != globalValues.end()) {
      return Flow(iter->second);
    }
    return Flow(NONCONSTANT_FLOW);
  }